

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_common.c
# Opt level: O0

char * mfb_get_key_name(mfb_key key)

{
  mfb_key key_local;
  char *local_8;
  
  switch(key) {
  default:
    local_8 = "Unknown";
    break;
  case KB_KEY_SPACE:
    local_8 = "Space";
    break;
  case KB_KEY_APOSTROPHE:
    local_8 = "Apostrophe";
    break;
  case KB_KEY_COMMA:
    local_8 = "Comma";
    break;
  case KB_KEY_MINUS:
    local_8 = "Minus";
    break;
  case KB_KEY_PERIOD:
    local_8 = "Period";
    break;
  case KB_KEY_SLASH:
    local_8 = "Slash";
    break;
  case KB_KEY_0:
    local_8 = "0";
    break;
  case KB_KEY_1:
    local_8 = "1";
    break;
  case KB_KEY_2:
    local_8 = "2";
    break;
  case KB_KEY_3:
    local_8 = "3";
    break;
  case KB_KEY_4:
    local_8 = "4";
    break;
  case KB_KEY_5:
    local_8 = "5";
    break;
  case KB_KEY_6:
    local_8 = "6";
    break;
  case KB_KEY_7:
    local_8 = "7";
    break;
  case KB_KEY_8:
    local_8 = "8";
    break;
  case KB_KEY_9:
    local_8 = "9";
    break;
  case KB_KEY_SEMICOLON:
    local_8 = "Semicolon";
    break;
  case KB_KEY_EQUAL:
    local_8 = "Equal";
    break;
  case KB_KEY_A:
    local_8 = "A";
    break;
  case KB_KEY_B:
    local_8 = "B";
    break;
  case KB_KEY_C:
    local_8 = "C";
    break;
  case KB_KEY_D:
    local_8 = "D";
    break;
  case KB_KEY_E:
    local_8 = "E";
    break;
  case KB_KEY_F:
    local_8 = "F";
    break;
  case KB_KEY_G:
    local_8 = "G";
    break;
  case KB_KEY_H:
    local_8 = "H";
    break;
  case KB_KEY_I:
    local_8 = "I";
    break;
  case KB_KEY_J:
    local_8 = "J";
    break;
  case KB_KEY_K:
    local_8 = "K";
    break;
  case KB_KEY_L:
    local_8 = "L";
    break;
  case KB_KEY_M:
    local_8 = "M";
    break;
  case KB_KEY_N:
    local_8 = "N";
    break;
  case KB_KEY_O:
    local_8 = "O";
    break;
  case KB_KEY_P:
    local_8 = "P";
    break;
  case KB_KEY_Q:
    local_8 = "Q";
    break;
  case KB_KEY_R:
    local_8 = "R";
    break;
  case KB_KEY_S:
    local_8 = "S";
    break;
  case KB_KEY_T:
    local_8 = "T";
    break;
  case KB_KEY_U:
    local_8 = "U";
    break;
  case KB_KEY_V:
    local_8 = "V";
    break;
  case KB_KEY_W:
    local_8 = "W";
    break;
  case KB_KEY_X:
    local_8 = "X";
    break;
  case KB_KEY_Y:
    local_8 = "Y";
    break;
  case KB_KEY_Z:
    local_8 = "Z";
    break;
  case KB_KEY_LEFT_BRACKET:
    local_8 = "Left_Bracket";
    break;
  case KB_KEY_BACKSLASH:
    local_8 = "Backslash";
    break;
  case KB_KEY_RIGHT_BRACKET:
    local_8 = "Right_Bracket";
    break;
  case KB_KEY_GRAVE_ACCENT:
    local_8 = "Grave_Accent";
    break;
  case KB_KEY_WORLD_1:
    local_8 = "World_1";
    break;
  case KB_KEY_WORLD_2:
    local_8 = "World_2";
    break;
  case KB_KEY_ESCAPE:
    local_8 = "Escape";
    break;
  case KB_KEY_ENTER:
    local_8 = "Enter";
    break;
  case KB_KEY_TAB:
    local_8 = "Tab";
    break;
  case KB_KEY_BACKSPACE:
    local_8 = "Backspace";
    break;
  case KB_KEY_INSERT:
    local_8 = "Insert";
    break;
  case KB_KEY_DELETE:
    local_8 = "Delete";
    break;
  case KB_KEY_RIGHT:
    local_8 = "Right";
    break;
  case KB_KEY_LEFT:
    local_8 = "Left";
    break;
  case KB_KEY_DOWN:
    local_8 = "Down";
    break;
  case KB_KEY_UP:
    local_8 = "Up";
    break;
  case KB_KEY_PAGE_UP:
    local_8 = "Page_Up";
    break;
  case KB_KEY_PAGE_DOWN:
    local_8 = "Page_Down";
    break;
  case KB_KEY_HOME:
    local_8 = "Home";
    break;
  case KB_KEY_END:
    local_8 = "End";
    break;
  case KB_KEY_CAPS_LOCK:
    local_8 = "Caps_Lock";
    break;
  case KB_KEY_SCROLL_LOCK:
    local_8 = "Scroll_Lock";
    break;
  case KB_KEY_NUM_LOCK:
    local_8 = "Num_Lock";
    break;
  case KB_KEY_PRINT_SCREEN:
    local_8 = "Print_Screen";
    break;
  case KB_KEY_PAUSE:
    local_8 = "Pause";
    break;
  case KB_KEY_F1:
    local_8 = "F1";
    break;
  case KB_KEY_F2:
    local_8 = "F2";
    break;
  case KB_KEY_F3:
    local_8 = "F3";
    break;
  case KB_KEY_F4:
    local_8 = "F4";
    break;
  case KB_KEY_F5:
    local_8 = "F5";
    break;
  case KB_KEY_F6:
    local_8 = "F6";
    break;
  case KB_KEY_F7:
    local_8 = "F7";
    break;
  case KB_KEY_F8:
    local_8 = "F8";
    break;
  case KB_KEY_F9:
    local_8 = "F9";
    break;
  case KB_KEY_F10:
    local_8 = "F10";
    break;
  case KB_KEY_F11:
    local_8 = "F11";
    break;
  case KB_KEY_F12:
    local_8 = "F12";
    break;
  case KB_KEY_F13:
    local_8 = "F13";
    break;
  case KB_KEY_F14:
    local_8 = "F14";
    break;
  case KB_KEY_F15:
    local_8 = "F15";
    break;
  case KB_KEY_F16:
    local_8 = "F16";
    break;
  case KB_KEY_F17:
    local_8 = "F17";
    break;
  case KB_KEY_F18:
    local_8 = "F18";
    break;
  case KB_KEY_F19:
    local_8 = "F19";
    break;
  case KB_KEY_F20:
    local_8 = "F20";
    break;
  case KB_KEY_F21:
    local_8 = "F21";
    break;
  case KB_KEY_F22:
    local_8 = "F22";
    break;
  case KB_KEY_F23:
    local_8 = "F23";
    break;
  case KB_KEY_F24:
    local_8 = "F24";
    break;
  case KB_KEY_F25:
    local_8 = "F25";
    break;
  case KB_KEY_KP_0:
    local_8 = "KP_0";
    break;
  case KB_KEY_KP_1:
    local_8 = "KP_1";
    break;
  case KB_KEY_KP_2:
    local_8 = "KP_2";
    break;
  case KB_KEY_KP_3:
    local_8 = "KP_3";
    break;
  case KB_KEY_KP_4:
    local_8 = "KP_4";
    break;
  case KB_KEY_KP_5:
    local_8 = "KP_5";
    break;
  case KB_KEY_KP_6:
    local_8 = "KP_6";
    break;
  case KB_KEY_KP_7:
    local_8 = "KP_7";
    break;
  case KB_KEY_KP_8:
    local_8 = "KP_8";
    break;
  case KB_KEY_KP_9:
    local_8 = "KP_9";
    break;
  case KB_KEY_KP_DECIMAL:
    local_8 = "KP_Decimal";
    break;
  case KB_KEY_KP_DIVIDE:
    local_8 = "KP_Divide";
    break;
  case KB_KEY_KP_MULTIPLY:
    local_8 = "KP_Multiply";
    break;
  case KB_KEY_KP_SUBTRACT:
    local_8 = "KP_Subtract";
    break;
  case KB_KEY_KP_ADD:
    local_8 = "KP_Add";
    break;
  case KB_KEY_KP_ENTER:
    local_8 = "KP_Enter";
    break;
  case KB_KEY_KP_EQUAL:
    local_8 = "KP_Equal";
    break;
  case KB_KEY_LEFT_SHIFT:
    local_8 = "Left_Shift";
    break;
  case KB_KEY_LEFT_CONTROL:
    local_8 = "Left_Control";
    break;
  case KB_KEY_LEFT_ALT:
    local_8 = "Left_Alt";
    break;
  case KB_KEY_LEFT_SUPER:
    local_8 = "Left_Super";
    break;
  case KB_KEY_RIGHT_SHIFT:
    local_8 = "Right_Shift";
    break;
  case KB_KEY_RIGHT_CONTROL:
    local_8 = "Right_Control";
    break;
  case KB_KEY_RIGHT_ALT:
    local_8 = "Right_Alt";
    break;
  case KB_KEY_RIGHT_SUPER:
    local_8 = "Right_Super";
    break;
  case KB_KEY_MENU:
    local_8 = "Menu";
    break;
  case KB_KEY_UNKNOWN:
    local_8 = "Unknown";
  }
  return local_8;
}

Assistant:

const char * 
mfb_get_key_name(mfb_key key) {

    switch (key)
    {
        case KB_KEY_SPACE:
            return "Space";

        case KB_KEY_APOSTROPHE:
            return "Apostrophe";

        case KB_KEY_COMMA:
            return "Comma";

        case KB_KEY_MINUS:
            return "Minus";

        case KB_KEY_PERIOD:
            return "Period";

        case KB_KEY_SLASH:
            return "Slash";

        case KB_KEY_0:
            return "0";

        case KB_KEY_1:
            return "1";

        case KB_KEY_2:
            return "2";

        case KB_KEY_3:
            return "3";

        case KB_KEY_4:
            return "4";

        case KB_KEY_5:
            return "5";

        case KB_KEY_6:
            return "6";

        case KB_KEY_7:
            return "7";

        case KB_KEY_8:
            return "8";

        case KB_KEY_9:
            return "9";

        case KB_KEY_SEMICOLON:
            return "Semicolon";

        case KB_KEY_EQUAL:
            return "Equal";

        case KB_KEY_A:
            return "A";

        case KB_KEY_B:
            return "B";

        case KB_KEY_C:
            return "C";

        case KB_KEY_D:
            return "D";

        case KB_KEY_E:
            return "E";

        case KB_KEY_F:
            return "F";

        case KB_KEY_G:
            return "G";

        case KB_KEY_H:
            return "H";

        case KB_KEY_I:
            return "I";

        case KB_KEY_J:
            return "J";

        case KB_KEY_K:
            return "K";

        case KB_KEY_L:
            return "L";

        case KB_KEY_M:
            return "M";

        case KB_KEY_N:
            return "N";

        case KB_KEY_O:
            return "O";

        case KB_KEY_P:
            return "P";

        case KB_KEY_Q:
            return "Q";

        case KB_KEY_R:
            return "R";

        case KB_KEY_S:
            return "S";

        case KB_KEY_T:
            return "T";

        case KB_KEY_U:
            return "U";

        case KB_KEY_V:
            return "V";

        case KB_KEY_W:
            return "W";

        case KB_KEY_X:
            return "X";

        case KB_KEY_Y:
            return "Y";

        case KB_KEY_Z:
            return "Z";

        case KB_KEY_LEFT_BRACKET:
            return "Left_Bracket";

        case KB_KEY_BACKSLASH:
            return "Backslash";

        case KB_KEY_RIGHT_BRACKET:
            return "Right_Bracket";

        case KB_KEY_GRAVE_ACCENT:
            return "Grave_Accent";

        case KB_KEY_WORLD_1:
            return "World_1";

        case KB_KEY_WORLD_2:
            return "World_2";

        case KB_KEY_ESCAPE:
            return "Escape";

        case KB_KEY_ENTER:
            return "Enter";

        case KB_KEY_TAB:
            return "Tab";

        case KB_KEY_BACKSPACE:
            return "Backspace";

        case KB_KEY_INSERT:
            return "Insert";

        case KB_KEY_DELETE:
            return "Delete";

        case KB_KEY_RIGHT:
            return "Right";

        case KB_KEY_LEFT:
            return "Left";

        case KB_KEY_DOWN:
            return "Down";

        case KB_KEY_UP:
            return "Up";

        case KB_KEY_PAGE_UP:
            return "Page_Up";

        case KB_KEY_PAGE_DOWN:
            return "Page_Down";

        case KB_KEY_HOME:
            return "Home";

        case KB_KEY_END:
            return "End";

        case KB_KEY_CAPS_LOCK:
            return "Caps_Lock";

        case KB_KEY_SCROLL_LOCK:
            return "Scroll_Lock";

        case KB_KEY_NUM_LOCK:
            return "Num_Lock";

        case KB_KEY_PRINT_SCREEN:
            return "Print_Screen";

        case KB_KEY_PAUSE:
            return "Pause";

        case KB_KEY_F1:
            return "F1";

        case KB_KEY_F2:
            return "F2";

        case KB_KEY_F3:
            return "F3";

        case KB_KEY_F4:
            return "F4";

        case KB_KEY_F5:
            return "F5";

        case KB_KEY_F6:
            return "F6";

        case KB_KEY_F7:
            return "F7";

        case KB_KEY_F8:
            return "F8";

        case KB_KEY_F9:
            return "F9";

        case KB_KEY_F10:
            return "F10";

        case KB_KEY_F11:
            return "F11";

        case KB_KEY_F12:
            return "F12";

        case KB_KEY_F13:
            return "F13";

        case KB_KEY_F14:
            return "F14";

        case KB_KEY_F15:
            return "F15";

        case KB_KEY_F16:
            return "F16";

        case KB_KEY_F17:
            return "F17";

        case KB_KEY_F18:
            return "F18";

        case KB_KEY_F19:
            return "F19";

        case KB_KEY_F20:
            return "F20";

        case KB_KEY_F21:
            return "F21";

        case KB_KEY_F22:
            return "F22";

        case KB_KEY_F23:
            return "F23";

        case KB_KEY_F24:
            return "F24";

        case KB_KEY_F25:
            return "F25";

        case KB_KEY_KP_0:
            return "KP_0";

        case KB_KEY_KP_1:
            return "KP_1";

        case KB_KEY_KP_2:
            return "KP_2";

        case KB_KEY_KP_3:
            return "KP_3";

        case KB_KEY_KP_4:
            return "KP_4";

        case KB_KEY_KP_5:
            return "KP_5";

        case KB_KEY_KP_6:
            return "KP_6";

        case KB_KEY_KP_7:
            return "KP_7";

        case KB_KEY_KP_8:
            return "KP_8";

        case KB_KEY_KP_9:
            return "KP_9";

        case KB_KEY_KP_DECIMAL:
            return "KP_Decimal";

        case KB_KEY_KP_DIVIDE:
            return "KP_Divide";

        case KB_KEY_KP_MULTIPLY:
            return "KP_Multiply";

        case KB_KEY_KP_SUBTRACT:
            return "KP_Subtract";

        case KB_KEY_KP_ADD:
            return "KP_Add";

        case KB_KEY_KP_ENTER:
            return "KP_Enter";

        case KB_KEY_KP_EQUAL:
            return "KP_Equal";

        case KB_KEY_LEFT_SHIFT:
            return "Left_Shift";

        case KB_KEY_LEFT_CONTROL:
            return "Left_Control";

        case KB_KEY_LEFT_ALT:
            return "Left_Alt";

        case KB_KEY_LEFT_SUPER:
            return "Left_Super";

        case KB_KEY_RIGHT_SHIFT:
            return "Right_Shift";

        case KB_KEY_RIGHT_CONTROL:
            return "Right_Control";

        case KB_KEY_RIGHT_ALT:
            return "Right_Alt";

        case KB_KEY_RIGHT_SUPER:
            return "Right_Super";

        case KB_KEY_MENU:
            return "Menu";

        case KB_KEY_UNKNOWN:
            return "Unknown";
    }
    
    return "Unknown";
}